

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtCore.c
# Opt level: O2

Aig_Man_t * Cgt_ClockGating(Aig_Man_t *pAig,Aig_Man_t *pCare,Cgt_Par_t *pPars)

{
  undefined8 in_RAX;
  Vec_Vec_t *vGates;
  Aig_Man_t *pAVar1;
  uint uVar2;
  int nNodesUsed;
  uint local_24;
  
  local_24 = (uint)((ulong)in_RAX >> 0x20);
  vGates = Cgt_ClockGatingInt(pAig,pCare,pPars,(Vec_Int_t *)0x0);
  pAVar1 = Cgt_ManDeriveGatedAig(pAig,vGates,pPars->fAreaOnly,(int *)&local_24);
  if (pPars->fVerbose != 0) {
    uVar2 = pAig->nObjs[6] + pAig->nObjs[5];
    printf("Nodes: Before CG = %6d. After CG = %6d. (%6.2f %%).  Total after CG = %6d.\n",
           ((double)(int)local_24 * 100.0) / (double)(int)uVar2,(ulong)uVar2,(ulong)local_24,
           (ulong)(uint)(pAVar1->nObjs[6] + pAVar1->nObjs[5]));
  }
  Vec_VecFree(vGates);
  return pAVar1;
}

Assistant:

Aig_Man_t * Cgt_ClockGating( Aig_Man_t * pAig, Aig_Man_t * pCare, Cgt_Par_t * pPars )
{
    Aig_Man_t * pGated;
    Vec_Vec_t * vGates = Cgt_ClockGatingInt( pAig, pCare, pPars, NULL );
    int nNodesUsed;
    if ( pPars->fVerbose )
    {
//        printf( "Before CG: " );
//        Aig_ManPrintStats( pAig );
    }
    pGated = Cgt_ManDeriveGatedAig( pAig, vGates, pPars->fAreaOnly, &nNodesUsed );
    if ( pPars->fVerbose )
    {
//        printf( "After  CG: " );
//        Aig_ManPrintStats( pGated );
        printf( "Nodes: Before CG = %6d. After CG = %6d. (%6.2f %%).  Total after CG = %6d.\n", 
            Aig_ManNodeNum(pAig), nNodesUsed, 
            100.0*nNodesUsed/Aig_ManNodeNum(pAig), 
            Aig_ManNodeNum(pGated) );
    }
    Vec_VecFree( vGates );
    return pGated;
}